

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeDoubletonWithConstantOnRight
          (OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Type TVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  Type type;
  Type type_00;
  uintptr_t uVar5;
  Type type_01;
  Type type_02;
  undefined1 auVar6 [40];
  undefined8 uVar7;
  bool bVar8;
  BinaryOp BVar9;
  uint uVar10;
  Index IVar11;
  BinaryOp BVar12;
  uint uVar13;
  ulong extraout_RDX;
  undefined1 auVar14 [8];
  optional<wasm::Type> type_03;
  undefined4 uStack_314;
  undefined8 local_300;
  anon_union_16_6_1532cd5a_for_Literal_0 local_2f8;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_2e8 [5];
  char local_218;
  Block *local_198;
  Binary *inner_4;
  Const *c2_4;
  undefined1 local_180 [8];
  Builder builder;
  undefined1 local_170 [48];
  anon_union_16_6_1532cd5a_for_Literal_0 local_140;
  HeapType *local_130;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_128;
  anon_union_16_6_1532cd5a_for_Literal_0 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined1 local_d8 [8];
  Binary *inner;
  undefined8 local_c8;
  undefined8 local_c0;
  Index local_ac;
  HeapType local_a8;
  Const *c1_5;
  Const *c2;
  undefined1 local_90 [8];
  Const *c1;
  undefined1 local_80 [16];
  anon_union_16_6_1532cd5a_for_Literal_0 *local_70;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_68;
  BinaryOp local_4c;
  HeapType local_48;
  Const *c1_1;
  undefined8 local_38;
  
  pEVar1 = curr->right;
  if (pEVar1->_id != ConstId) goto LAB_009e97ee;
  auVar14 = (undefined1  [8])curr->left;
  local_2e8[0].binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_2e8[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_2f8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90;
  local_38 = curr;
  if (((((Block *)auVar14)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id
       == BinaryId) &&
     (local_90 = (undefined1  [8])
                 (((Block *)auVar14)->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data,
     (((Block *)local_90)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id
     == ConstId)) {
    Literal::Literal((Literal *)&local_118.func,(Literal *)&((Block *)local_90)->name);
    bVar8 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(local_2e8,
                      (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                      &local_118.func);
    Literal::~Literal((Literal *)&local_118.func);
    if (!bVar8) goto LAB_009e8b2b;
    bVar8 = true;
    if ((int)(((Block *)auVar14)->name).super_IString.str._M_len !=
        (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
        .field_0.i32) goto LAB_009e8b2d;
    TVar2.id = (((Block *)auVar14)->super_SpecificExpression<(wasm::Expression::Id)1>).
               super_Expression.type.id;
    if (6 < TVar2.id) goto LAB_009e980d;
    BVar12 = (BinaryOp)(((Block *)auVar14)->name).super_IString.str._M_len;
    if (BVar12 == *(BinaryOp *)(&DAT_00e16374 + TVar2.id * 4)) {
      Literal::and_((Literal *)&local_2f8.func,
                    (((Literals *)((long)local_90 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    fixed._M_elems,(Literal *)(pEVar1 + 1));
      Literal::operator=((((Literals *)((long)local_90 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                         .fixed._M_elems,(Literal *)&local_2f8.func);
LAB_009e9644:
      Literal::~Literal((Literal *)&local_2f8.func);
      local_90 = auVar14;
LAB_009e9652:
      bVar8 = false;
      auVar14 = local_90;
    }
    else {
      if (BVar12 == *(BinaryOp *)(&DAT_00e16548 + TVar2.id * 4)) {
        Literal::or_((Literal *)&local_2f8.func,
                     (((Literals *)((long)local_90 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     fixed._M_elems,(Literal *)(pEVar1 + 1));
        Literal::operator=((((Literals *)((long)local_90 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                           (Literal *)&local_2f8.func);
        goto LAB_009e9644;
      }
      if (BVar12 == *(BinaryOp *)(&DAT_00e1633c + TVar2.id * 4)) {
        Literal::xor_((Literal *)&local_2f8.func,
                      (((Literals *)((long)local_90 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      fixed._M_elems,(Literal *)(pEVar1 + 1));
        Literal::operator=((((Literals *)((long)local_90 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                           (Literal *)&local_2f8.func);
        goto LAB_009e9644;
      }
      if (BVar12 == *(BinaryOp *)(&DAT_00e16510 + TVar2.id * 4)) {
        Literal::mul((Literal *)&local_2f8.func,
                     (((Literals *)((long)local_90 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     fixed._M_elems,(Literal *)(pEVar1 + 1));
        Literal::operator=((((Literals *)((long)local_90 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                           (Literal *)&local_2f8.func);
        goto LAB_009e9644;
      }
      if ((BVar12 < EqInt64) && ((0xf800007c00U >> ((ulong)BVar12 & 0x3f) & 1) != 0)) {
        c2_4 = (Const *)(ulong)BVar12;
        local_4c = BVar12;
        local_ac = Bits::getEffectiveShifts((Expression *)local_90);
        IVar11 = Bits::getEffectiveShifts(pEVar1);
        uVar5 = (((Literals *)((long)local_90 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                usedFixed;
        uVar10 = 0x1f;
        if (uVar5 != 2) {
          if (uVar5 != 3) goto LAB_009e9882;
          uVar10 = 0x3f;
        }
        uVar13 = IVar11 + local_ac;
        if (uVar13 == (uVar10 & uVar13)) {
          Literal::makeFromInt32
                    ((Literal *)&local_2f8.func,uVar13,
                     (Type)(((Literals *)((long)local_90 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).usedFixed);
          Literal::operator=((((Literals *)((long)local_90 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                             (Literal *)&local_2f8.func);
          goto LAB_009e9644;
        }
        if ((local_4c < EqInt64) && ((0xc000006000U >> ((ulong)c2_4 & 0x3f) & 1) != 0)) {
          Literal::makeFromInt32
                    ((Literal *)&local_2f8.func,uVar10 & uVar13,
                     (Type)(((Literals *)((long)local_90 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).usedFixed);
          Literal::operator=((((Literals *)((long)local_90 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                             (Literal *)&local_2f8.func);
          goto LAB_009e9644;
        }
        BVar12 = Abstract::getBinary(TVar2,Shl);
        if ((local_4c != BVar12) &&
           (BVar9 = Abstract::getBinary(TVar2,ShrU), BVar12 = local_4c, local_4c != BVar9)) {
          BVar9 = Abstract::getBinary(TVar2,ShrS);
          if (BVar12 != BVar9) goto LAB_009e8b2d;
          uVar10 = wasm::Type::getByteSize((Type *)((long)local_90 + 8));
          Literal::makeFromInt32
                    ((Literal *)&local_2f8.func,uVar10 * 8 + -1,
                     (Type)(((Literals *)((long)local_90 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).usedFixed);
          Literal::operator=((((Literals *)((long)local_90 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                             (Literal *)&local_2f8.func);
          goto LAB_009e9644;
        }
        pEVar1 = (Expression *)(((Block *)auVar14)->name).super_IString.str._M_str;
        Literal::makeZero((Literal *)&local_2f8.func,
                          (Type)(((Literals *)((long)local_90 + 8))->
                                super_SmallVector<wasm::Literal,_1UL>).usedFixed);
        Literal::operator=((((Literals *)((long)local_90 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                           (Literal *)&local_2f8.func);
        Literal::~Literal((Literal *)&local_2f8.func);
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)&local_2f8.func,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currModule,pEVar1);
        if (local_218 == '\0') {
          bVar8 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)&local_2f8.func);
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&local_2f8.func);
          if (bVar8) goto LAB_009e9725;
        }
        else {
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&local_2f8.func);
LAB_009e9725:
          local_180 = (undefined1  [8])
                      (this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .currModule;
          local_118.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)Builder::makeDrop((Builder *)local_180,pEVar1);
          local_118.func.super_IString.str._M_str = (char *)local_90;
          local_2f8.func.super_IString.str._M_str = (char *)0x2;
          type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)extraout_RDX;
          local_2f8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_118;
          local_90 = (undefined1  [8])
                     Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                               ((Builder *)local_180,
                                (initializer_list<wasm::Expression_*> *)&local_2f8.func,type_03);
        }
        goto LAB_009e9652;
      }
    }
  }
  else {
LAB_009e8b2b:
    bVar8 = true;
  }
LAB_009e8b2d:
  uVar7 = local_38;
  if (!bVar8) {
    return (Expression *)auVar14;
  }
  bVar8 = false;
  local_170._0_8_ = &local_140;
  local_140.i64 = 0;
  local_170._8_8_ = &local_2f8;
  local_2e8[0].binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_2e8[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_2f8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_48;
  local_180 = (undefined1  [8])local_d8;
  builder.wasm._0_4_ = 10;
  local_80._8_8_ = &local_118;
  local_108 = 0;
  local_f8 = 0;
  local_118.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&c1_5;
  local_90 = (undefined1  [8])0x0;
  c1._0_4_ = 5;
  local_80._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_180;
  if ((((SpecificExpression<(wasm::Expression::Id)16> *)&((element_type *)local_38)->type)->
      super_Expression)._id == BinaryId) {
    BVar12 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
             _M_elems[0].field_0.i32;
    p_Var3 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
             _M_elems[0].field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    TVar2.id._0_4_ = p_Var3->_M_use_count;
    TVar2.id._4_4_ = p_Var3->_M_weak_count;
    BVar9 = Abstract::getBinary(TVar2,Mul);
    if (BVar12 == BVar9) {
      bVar8 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )uVar7,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)local_80);
    }
    else {
      bVar8 = false;
    }
  }
  if (bVar8 != false) {
    uVar4 = ((Type *)((long)local_d8 + 8))->id;
    if (6 < uVar4) goto LAB_009e980d;
    *(undefined4 *)((long)local_d8 + 0x10) = *(undefined4 *)(&DAT_00e16510 + uVar4 * 4);
    Literal::shl((Literal *)&local_2f8.func,&c1_5->value,(Literal *)(local_48.id + 0x10));
    Literal::operator=((Literal *)(local_48.id + 0x10),(Literal *)&local_2f8.func);
    Literal::~Literal((Literal *)&local_2f8.func);
    auVar14 = local_d8;
  }
  uVar7 = local_38;
  if (bVar8 != false) {
    return (Expression *)auVar14;
  }
  bVar8 = false;
  local_140.i64 = 0;
  local_2e8[0].binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_2e8[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_2f8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_48;
  local_180 = (undefined1  [8])local_d8;
  builder.wasm._0_4_ = 5;
  local_170._0_8_ = &local_140;
  local_170._8_8_ = &local_2f8;
  local_108 = 0;
  local_f8 = 0;
  local_118.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&c1_5;
  local_90 = (undefined1  [8])0x0;
  c1._0_4_ = 10;
  local_80._8_8_ = &local_118;
  local_80._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_180;
  if ((((SpecificExpression<(wasm::Expression::Id)16> *)&((element_type *)local_38)->type)->
      super_Expression)._id == BinaryId) {
    BVar12 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
             _M_elems[0].field_0.i32;
    p_Var3 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
             _M_elems[0].field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    type.id._0_4_ = p_Var3->_M_use_count;
    type.id._4_4_ = p_Var3->_M_weak_count;
    BVar9 = Abstract::getBinary(type,Shl);
    if (BVar12 == BVar9) {
      bVar8 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )uVar7,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)local_80);
    }
    else {
      bVar8 = false;
    }
  }
  uVar7 = local_38;
  if (bVar8 != false) {
    Literal::shl((Literal *)&local_2f8.func,(Literal *)(local_48.id + 0x10),&c1_5->value);
    Literal::operator=((Literal *)(local_48.id + 0x10),(Literal *)&local_2f8.func);
    Literal::~Literal((Literal *)&local_2f8.func);
    return (Expression *)local_d8;
  }
  local_140.i64 = 0;
  local_2e8[0].binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_2e8[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_2f8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_48;
  local_90 = (undefined1  [8])local_d8;
  local_80._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
  local_70 = &local_140;
  local_68 = &local_2f8;
  local_108 = 0;
  local_f8 = 0;
  local_118.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&c1_5;
  local_180 = (undefined1  [8])0x0;
  builder.wasm._0_4_ = 10;
  local_170._0_8_ = local_90;
  local_170._8_8_ = &local_118;
  if ((((((SpecificExpression<(wasm::Expression::Id)16> *)&((element_type *)local_38)->type)->
        super_Expression)._id == BinaryId) &&
      (BVar12 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                _M_elems[0].field_0.i32,
      p_Var3 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
               _M_elems[0].field_0.gcData.
               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
      type_00.id._0_4_ = p_Var3->_M_use_count, type_00.id._4_4_ = p_Var3->_M_weak_count,
      BVar9 = Abstract::getBinary(type_00,Shl), BVar12 == BVar9)) &&
     (bVar8 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )uVar7,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)local_170), bVar8)) {
    uVar4 = ((Type *)((long)local_d8 + 8))->id;
    if (6 < uVar4) {
LAB_009e980d:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    if ((*(int *)((long)local_d8 + 0x10) != *(int *)(&DAT_00e1652c + uVar4 * 4)) &&
       (*(int *)((long)local_d8 + 0x10) != *(int *)(&DAT_00e16358 + uVar4 * 4))) goto LAB_009e8ec8;
    if (*(char *)local_48.id != '\x0e') goto LAB_009e97ee;
    uVar5 = ((Type *)(local_48.id + 8))->id;
    if (uVar5 == 3) {
      if (*(long *)(local_48.id + 0x20) != 3) goto LAB_009e9863;
      uVar10 = *(uint *)(local_48.id + 0x10) & 0x3f;
    }
    else {
      if (uVar5 != 2) goto LAB_009e982c;
      if (*(long *)(local_48.id + 0x20) != 2) goto LAB_009e9844;
      uVar10 = *(uint *)(local_48.id + 0x10) & 0x1f;
    }
    if ((c1_5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId)
    goto LAB_009e97ee;
    uVar5 = (c1_5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
    if (uVar5 == 3) {
      if ((c1_5->value).type.id != 3) goto LAB_009e9863;
      uVar13 = (c1_5->value).field_0.i32 & 0x3f;
    }
    else {
      if (uVar5 != 2) goto LAB_009e982c;
      if ((c1_5->value).type.id != 2) goto LAB_009e9844;
      uVar13 = (c1_5->value).field_0.i32 & 0x1f;
    }
    bVar8 = true;
    if (uVar10 == uVar13) {
      uVar4 = ((Type *)(local_48.id + 8))->id;
      if (uVar4 == 2) {
        IVar11 = Bits::getEffectiveShifts((Expression *)local_48.id);
        Literal::makeFromInt32((Literal *)&local_2f8.func,-1 << ((byte)IVar11 & 0x1f),(Type)0x2);
        Literal::operator=((Literal *)(local_48.id + 0x10),(Literal *)&local_2f8.func);
      }
      else {
        IVar11 = Bits::getEffectiveShifts((Expression *)local_48.id);
        Literal::makeFromInt64((Literal *)&local_2f8.func,-1L << ((byte)IVar11 & 0x3f),(Type)0x3);
        Literal::operator=((Literal *)(local_48.id + 0x10),(Literal *)&local_2f8.func);
      }
      Literal::~Literal((Literal *)&local_2f8.func);
      if (6 < uVar4) goto LAB_009e980d;
      *(undefined4 *)((long)local_d8 + 0x10) = *(undefined4 *)(&DAT_00e16374 + uVar4 * 4);
      bVar8 = false;
      auVar14 = local_d8;
    }
  }
  else {
LAB_009e8ec8:
    bVar8 = true;
  }
  uVar7 = local_38;
  if (!bVar8) {
    return (Expression *)(Block *)auVar14;
  }
  local_140.i64 = 0;
  local_2e8[0].binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_2e8[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_2f8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_48;
  local_180 = (undefined1  [8])local_d8;
  builder.wasm._0_4_ = 10;
  local_170._0_8_ = &local_140;
  local_170._8_8_ = &local_2f8;
  local_108 = 0;
  local_f8 = 0;
  local_118.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&c1_5;
  local_90 = (undefined1  [8])0x0;
  c1._0_4_ = 0xb;
  local_80._8_8_ = &local_118;
  if ((((((SpecificExpression<(wasm::Expression::Id)16> *)&((element_type *)local_38)->type)->
        super_Expression)._id == BinaryId) &&
      (BVar12 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                _M_elems[0].field_0.i32,
      p_Var3 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
               _M_elems[0].field_0.gcData.
               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
      type_01.id._0_4_ = p_Var3->_M_use_count, type_01.id._4_4_ = p_Var3->_M_weak_count,
      local_80._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_180,
      BVar9 = Abstract::getBinary(type_01,ShrU), BVar12 == BVar9)) &&
     (bVar8 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )uVar7,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)local_80), bVar8)) {
    if (*(char *)local_48.id != '\x0e') goto LAB_009e97ee;
    uVar5 = ((Type *)(local_48.id + 8))->id;
    if (uVar5 == 3) {
      if (*(long *)(local_48.id + 0x20) != 3) goto LAB_009e9863;
      uVar10 = *(uint *)(local_48.id + 0x10) & 0x3f;
    }
    else {
      if (uVar5 != 2) goto LAB_009e982c;
      if (*(long *)(local_48.id + 0x20) != 2) goto LAB_009e9844;
      uVar10 = *(uint *)(local_48.id + 0x10) & 0x1f;
    }
    if ((c1_5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId)
    goto LAB_009e97ee;
    uVar5 = (c1_5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
    if (uVar5 == 3) {
      if ((c1_5->value).type.id != 3) goto LAB_009e9863;
      uVar13 = (c1_5->value).field_0.i32 & 0x3f;
    }
    else {
      if (uVar5 != 2) goto LAB_009e982c;
      if ((c1_5->value).type.id != 2) goto LAB_009e9844;
      uVar13 = (c1_5->value).field_0.i32 & 0x1f;
    }
    bVar8 = true;
    if (uVar10 == uVar13) {
      TVar2.id = ((Type *)(local_48.id + 8))->id;
      if (TVar2.id == 2) {
        IVar11 = Bits::getEffectiveShifts((Expression *)local_48.id);
        Literal::makeFromInt32
                  ((Literal *)&local_2f8.func,0xffffffff >> ((byte)IVar11 & 0x1f),(Type)0x2);
        Literal::operator=((Literal *)(local_48.id + 0x10),(Literal *)&local_2f8.func);
      }
      else {
        IVar11 = Bits::getEffectiveShifts((Expression *)local_48.id);
        Literal::makeFromInt64
                  ((Literal *)&local_2f8.func,0xffffffffffffffff >> ((byte)IVar11 & 0x3f),(Type)0x3)
        ;
        Literal::operator=((Literal *)(local_48.id + 0x10),(Literal *)&local_2f8.func);
      }
      Literal::~Literal((Literal *)&local_2f8.func);
      BVar12 = Abstract::getBinary(TVar2,And);
      *(BinaryOp *)((long)local_d8 + 0x10) = BVar12;
      bVar8 = false;
      auVar14 = local_d8;
    }
  }
  else {
    bVar8 = true;
  }
  uVar7 = local_38;
  if (!bVar8) {
    return (Expression *)auVar14;
  }
  local_48.id = 0;
  local_2e8[0].binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_2e8[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  local_2f8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffff58;
  local_140._8_4_ = 0xe;
  local_130 = &local_48;
  local_128 = &local_2f8;
  local_108 = 0;
  local_f8 = 0;
  local_90 = (undefined1  [8])0x0;
  c1._0_4_ = 0xd;
  local_80._0_8_ = &local_140;
  local_80._8_8_ = &local_118;
  local_140.i64 = (int64_t)(Block *)&local_198;
  local_118.i64 = (int64_t)(element_type *)&inner_4;
  if ((((((SpecificExpression<(wasm::Expression::Id)16> *)&((element_type *)local_38)->type)->
        super_Expression)._id != BinaryId) ||
      (BVar12 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                _M_elems[0].field_0.i32,
      p_Var3 = (((element_type *)local_38)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
               _M_elems[0].field_0.gcData.
               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
      type_02.id._0_4_ = p_Var3->_M_use_count, type_02.id._4_4_ = p_Var3->_M_weak_count,
      BVar9 = Abstract::getBinary(type_02,RotL), BVar12 != BVar9)) ||
     (bVar8 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )uVar7,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)local_80), !bVar8)) {
    local_90 = (undefined1  [8])&stack0xffffffffffffff58;
    c1_5 = (Const *)0x0;
    local_80._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
    local_70 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
    inner._0_4_ = 0xd;
    local_c8 = &c1_5;
    local_c0 = local_90;
    local_170._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
    local_170._16_8_ = (MixedArena *)0x0;
    auVar6._4_4_ = uStack_314;
    auVar6._0_4_ = 0xe;
    auVar6._8_8_ = (HeapType *)local_d8;
    auVar6._16_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_180;
    auVar6._24_8_ = local_300;
    auVar6._32_8_ = 0;
    local_180 = (undefined1  [8])&inner_4;
    local_d8 = (undefined1  [8])&local_198;
    bVar8 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                      ((Expression *)local_38,
                       (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                        )(auVar6 << 0x40));
    if (!bVar8) {
      return (Expression *)(Block *)0x0;
    }
  }
  if (*(char *)local_a8.id == '\x0e') {
    if (*(long *)(local_a8.id + 8) == 3) {
      if (*(long *)(local_a8.id + 0x20) != 3) goto LAB_009e9863;
      uVar10 = (uint)((Type *)(local_a8.id + 0x10))->id;
    }
    else {
      if (*(long *)(local_a8.id + 8) != 2) goto LAB_009e982c;
      if (*(long *)(local_a8.id + 0x20) != 2) goto LAB_009e9844;
      uVar10 = (uint)((Type *)(local_a8.id + 0x10))->id & 0x1f;
    }
    if ((inner_4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
        ConstId) {
      uVar5 = (inner_4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id
      ;
      if (uVar5 == 3) {
        if (inner_4->right != (Expression *)0x3) {
LAB_009e9863:
          __assert_fail("type == Type::i64",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x129,"int64_t wasm::Literal::geti64() const");
        }
        BVar12 = inner_4->op;
      }
      else {
        if (uVar5 != 2) {
LAB_009e982c:
          handle_unreachable("unexpected type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                             ,0x4a);
        }
        if (inner_4->right != (Expression *)0x2) {
LAB_009e9844:
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x120,"int32_t wasm::Literal::geti32() const");
        }
        BVar12 = inner_4->op & RemUInt64;
      }
      TVar2.id = (inner_4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type
                 .id;
      uVar13 = 0x1f;
      if (TVar2.id != 2) {
        if (TVar2.id != 3) {
LAB_009e9882:
          handle_unreachable("unexpected type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                             ,0x40);
        }
        uVar13 = 0x3f;
      }
      Literal::makeFromInt32((Literal *)&local_2f8.func,uVar10 - BVar12 & uVar13,TVar2);
      Literal::operator=((Literal *)(local_a8.id + 0x10),(Literal *)&local_2f8.func);
      Literal::~Literal((Literal *)&local_2f8.func);
      return (Expression *)local_198;
    }
  }
LAB_009e97ee:
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
}

Assistant:

Expression* optimizeDoubletonWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    {
      Binary* inner;
      Const *c1, *c2 = curr->right->cast<Const>();
      if (matches(curr->left, binary(&inner, any(), ival(&c1))) &&
          inner->op == curr->op) {
        Type type = inner->type;
        BinaryOp op = inner->op;
        // (x & C1) & C2   =>   x & (C1 & C2)
        if (op == getBinary(type, And)) {
          c1->value = c1->value.and_(c2->value);
          return inner;
        }
        // (x | C1) | C2   =>   x | (C1 | C2)
        if (op == getBinary(type, Or)) {
          c1->value = c1->value.or_(c2->value);
          return inner;
        }
        // (x ^ C1) ^ C2   =>   x ^ (C1 ^ C2)
        if (op == getBinary(type, Xor)) {
          c1->value = c1->value.xor_(c2->value);
          return inner;
        }
        // (x * C1) * C2   =>   x * (C1 * C2)
        if (op == getBinary(type, Mul)) {
          c1->value = c1->value.mul(c2->value);
          return inner;
        }
        // TODO:
        // handle signed / unsigned divisions. They are more complex

        // (x <<>> C1) <<>> C2   =>   x <<>> (C1 + C2)
        if (hasAnyShift(op)) {
          // shifts only use an effective amount from the constant, so
          // adding must be done carefully
          auto total =
            Bits::getEffectiveShifts(c1) + Bits::getEffectiveShifts(c2);
          auto effectiveTotal = Bits::getEffectiveShifts(total, c1->type);
          if (total == effectiveTotal) {
            // no overflow, we can do this
            c1->value = Literal::makeFromInt32(total, c1->type);
            return inner;
          } else {
            // overflow. Handle different scenarious
            if (hasAnyRotateShift(op)) {
              // overflow always accepted in rotation shifts
              c1->value = Literal::makeFromInt32(effectiveTotal, c1->type);
              return inner;
            }
            // handle overflows for general shifts
            //   x << C1 << C2    =>   0 or { drop(x), 0 }
            //   x >>> C1 >>> C2  =>   0 or { drop(x), 0 }
            // iff `C1 + C2` -> overflows
            if ((op == getBinary(type, Shl) || op == getBinary(type, ShrU))) {
              auto* x = inner->left;
              c1->value = Literal::makeZero(c1->type);
              if (!effects(x).hasSideEffects()) {
                //  =>  0
                return c1;
              } else {
                //  =>  { drop(x), 0 }
                Builder builder(*getModule());
                return builder.makeBlock({builder.makeDrop(x), c1});
              }
            }
            //   i32(x) >> C1 >> C2   =>   x >> 31
            //   i64(x) >> C1 >> C2   =>   x >> 63
            // iff `C1 + C2` -> overflows
            if (op == getBinary(type, ShrS)) {
              c1->value = Literal::makeFromInt32(c1->type.getByteSize() * 8 - 1,
                                                 c1->type);
              return inner;
            }
          }
        }
      }
    }
    {
      // (x << C1) * C2   =>   x * (C2 << C1)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Mul, binary(&inner, Shl, any(), ival(&c1)), ival(&c2)))) {
        inner->op = getBinary(inner->type, Mul);
        c1->value = c2->value.shl(c1->value);
        return inner;
      }
    }
    {
      // (x * C1) << C2   =>   x * (C1 << C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Shl, binary(&inner, Mul, any(), ival(&c1)), ival(&c2)))) {
        c1->value = c1->value.shl(c2->value);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x >> C)  << C   =>   x & -(1 << C)
      // (x >>> C) << C   =>   x & -(1 << C)
      Binary* inner;
      Const *c1, *c2;
      if (matches(curr,
                  binary(Shl, binary(&inner, any(), ival(&c1)), ival(&c2))) &&
          (inner->op == getBinary(inner->type, ShrS) ||
           inner->op == getBinary(inner->type, ShrU)) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -(1U << Bits::getEffectiveShifts(c1)), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -(1ULL << Bits::getEffectiveShifts(c1)), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x << C) >>> C   =>   x & (-1 >>> C)
      // (x << C) >> C    =>   skip
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(ShrU, binary(&inner, Shl, any(), ival(&c1)), ival(&c2))) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -1U >> Bits::getEffectiveShifts(c1), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -1ULL >> Bits::getEffectiveShifts(c1), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add canonicalization rotr to rotl and remove these rules.
      // rotl(rotr(x, C1), C2)   =>   rotr(x, C1 - C2)
      // rotr(rotl(x, C1), C2)   =>   rotl(x, C1 - C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(RotL, binary(&inner, RotR, any(), ival(&c1)), ival(&c2))) ||
          matches(
            curr,
            binary(RotR, binary(&inner, RotL, any(), ival(&c1)), ival(&c2)))) {
        auto diff = Bits::getEffectiveShifts(c1) - Bits::getEffectiveShifts(c2);
        c1->value = Literal::makeFromInt32(
          Bits::getEffectiveShifts(diff, c2->type), c2->type);
        return inner;
      }
    }
    return nullptr;
  }